

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O3

void __thiscall V2Synth::renderFrame(V2Synth *this)

{
  StereoSample *dest;
  size_t __n;
  float fVar1;
  float fVar2;
  uint32_t len;
  bool bVar3;
  long lVar4;
  bool bVar5;
  long lVar6;
  V2Voice *this_00;
  long lVar7;
  StereoSample *dest_00;
  ulong uVar8;
  int chan;
  ulong uVar9;
  float fVar10;
  
  len = (this->instance).SRcFrameSize;
  lVar6 = (long)(int)len;
  dest_00 = (this->instance).mixbuf;
  __n = lVar6 * 8;
  uVar9 = 0;
  memset(dest_00,0,__n);
  memset((this->instance).aux1buf,0,lVar6 * 4);
  memset((this->instance).aux2buf,0,lVar6 * 4);
  memset((this->instance).auxabuf,0,__n);
  memset((this->instance).auxbbuf,0,__n);
  dest = (this->instance).chanbuf;
  do {
    uVar8 = 0;
    this_00 = this->voicesw;
    while (uVar9 != (uint)this->chanmap[uVar8]) {
      uVar8 = uVar8 + 1;
      this_00 = this_00 + 1;
      if (uVar8 == 0x40) goto LAB_00108e39;
    }
    memset(dest,0,__n);
    if (uVar8 < 0x40) {
      do {
        if (uVar9 == (uint)this->chanmap[uVar8]) {
          V2Voice::render(this_00,dest,len);
        }
        uVar8 = uVar8 + 1;
        this_00 = this_00 + 1;
      } while (uVar8 != 0x40);
    }
    if (uVar9 == 0xf) {
      ronanCBProcess((syWRonan *)&this->ronan,dest->ch,len);
    }
    V2Chan::process(this->chansw + uVar9,len);
LAB_00108e39:
    uVar9 = uVar9 + 1;
    if (uVar9 == 0x10) {
      V2Reverb::render(&this->reverb,dest_00,len);
      V2ModDel::renderAux2Main(&this->delay,dest_00,len);
      V2DCFilter::renderStereo(&this->dcf,dest_00,dest_00,len);
      if (0 < (int)len) {
        fVar1 = this->lcfreq;
        fVar2 = this->hcfreq;
        lVar4 = 0;
        do {
          lVar7 = 0;
          bVar3 = true;
          do {
            bVar5 = bVar3;
            fVar10 = dest_00->ch[lVar4 * 2 + lVar7] - this->lcbuf[lVar7];
            this->lcbuf[lVar7] = fVar1 * fVar10 + this->lcbuf[lVar7];
            if ((fVar2 != 1.0) || (NAN(fVar2))) {
              fVar10 = (fVar10 - this->hcbuf[lVar7]) * fVar2 + this->hcbuf[lVar7];
              this->hcbuf[lVar7] = fVar10;
            }
            dest_00->ch[lVar4 * 2 + lVar7] = fVar10;
            lVar7 = 1;
            bVar3 = false;
          } while (bVar5);
          lVar4 = lVar4 + 1;
        } while (lVar4 != lVar6);
      }
      V2Comp::render(&this->compr,dest_00,len);
      return;
    }
  } while( true );
}

Assistant:

void renderFrame()
    {
        int nsamples = instance.SRcFrameSize;

        // clear output buffer
        memset(instance.mixbuf, 0, nsamples * sizeof(StereoSample));

        // clear aux buffers
        memset(instance.aux1buf, 0, nsamples * sizeof(float));
        memset(instance.aux2buf, 0, nsamples * sizeof(float));
        memset(instance.auxabuf, 0, nsamples * sizeof(StereoSample));
        memset(instance.auxbbuf, 0, nsamples * sizeof(StereoSample));

        // process all channels
        for (int chan = 0; chan < CHANS; chan++)
        {
            // check if any voices are active on this channel
            int voice = 0;
            while (voice < POLY && chanmap[voice] != chan)
                voice++;

            if (voice == POLY)
                continue;

            // clear channel buffer
            memset(instance.chanbuf, 0, nsamples * sizeof(StereoSample));

            // render all voices on this channel
            for (; voice < POLY; voice++)
            {
                if (chanmap[voice] != chan)
                    continue;

                voicesw[voice].render(instance.chanbuf, nsamples);
            }

            // channel 15 -> Ronan
            if (chan == CHANS - 1)
                ronanCBProcess(&ronan, &instance.chanbuf[0].l, nsamples);

            chansw[chan].process(nsamples);
        }

        // global filters
        StereoSample *mix = instance.mixbuf;
        reverb.render(mix, nsamples);
        delay.renderAux2Main(mix, nsamples);
        dcf.renderStereo(mix, mix, nsamples);

        // low cut/high cut
        float lcf = lcfreq, hcf = hcfreq;
        for (int i = 0; i < nsamples; i++)
        {
            for (int ch = 0; ch < 2; ch++)
            {
                // low cut
                float x = mix[i].ch[ch] - lcbuf[ch];
                lcbuf[ch] += lcf * x;

                // high cut
                if (hcf != 1.0f)
                {
                    hcbuf[ch] += hcf * (x - hcbuf[ch]);
                    x = hcbuf[ch];
                }

                mix[i].ch[ch] = x;
            }
        }

        // sum compressor
        compr.render(mix, nsamples);

        DEBUG_PLOT_STEREO(mix, mix, nsamples);
    }